

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow.c
# Opt level: O3

void aom_compute_flow_at_point_c
               (uint8_t *src,uint8_t *ref,int x,int y,int width,int height,int stride,double *u,
               double *v)

{
  ulong uVar1;
  double __x;
  undefined1 auVar2 [12];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [12];
  undefined1 auVar7 [14];
  undefined1 auVar8 [12];
  unkbyte10 Var9;
  int i;
  int iVar10;
  short *psVar11;
  uint8_t *puVar12;
  undefined1 *puVar13;
  short *psVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar25 [16];
  int iVar26;
  int iVar30;
  double dVar27;
  double dVar28;
  double dVar29;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar36;
  double dVar34;
  double dVar35;
  double __x_00;
  int iVar37;
  int iVar39;
  double dVar38;
  int iVar40;
  int iVar43;
  double dVar41;
  int iVar44;
  int iVar45;
  undefined1 auVar42 [16];
  ushort uVar52;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  double dVar53;
  undefined1 auVar54 [16];
  undefined1 auVar61 [16];
  int16_t dy [64];
  int16_t dx [64];
  int16_t tmp_ [80];
  undefined4 uStack_304;
  undefined4 uStack_300;
  undefined4 uStack_2fc;
  short local_298 [64];
  short local_218 [64];
  short local_198 [48];
  undefined1 local_138 [264];
  undefined1 auVar48 [16];
  undefined1 auVar51 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  short sVar58;
  short sVar59;
  short sVar60;
  
  iVar10 = stride * y + x;
  uVar16 = ~stride;
  lVar17 = -1;
  do {
    lVar19 = 0;
    uVar18 = uVar16;
    do {
      lVar20 = 0;
      sVar58 = 0;
      uVar15 = uVar18;
      do {
        sVar58 = sVar58 + (ushort)src[(long)(int)uVar15 + (long)iVar10] *
                          *(short *)((long)&sobel_filter_sobel_a + lVar20);
        lVar20 = lVar20 + 2;
        uVar15 = uVar15 + 1;
      } while (lVar20 != 6);
      local_198[lVar17 * 8 + lVar19 + 8] = sVar58;
      lVar19 = lVar19 + 1;
      uVar18 = uVar18 + 1;
    } while (lVar19 != 8);
    lVar17 = lVar17 + 1;
    uVar16 = uVar16 + stride;
  } while (lVar17 != 9);
  psVar11 = local_198;
  lVar17 = 0;
  do {
    lVar19 = 0;
    psVar14 = psVar11;
    do {
      lVar20 = 0;
      sVar58 = 0;
      do {
        sVar58 = sVar58 + psVar14[lVar20 * 4] * *(short *)((long)&sobel_filter_sobel_b + lVar20);
        lVar20 = lVar20 + 2;
      } while (lVar20 != 6);
      local_218[lVar17 * 8 + lVar19] = sVar58;
      lVar19 = lVar19 + 1;
      psVar14 = psVar14 + 1;
    } while (lVar19 != 8);
    lVar17 = lVar17 + 1;
    psVar11 = psVar11 + 8;
  } while (lVar17 != 8);
  uVar16 = ~stride;
  lVar17 = -1;
  do {
    lVar19 = 0;
    uVar18 = uVar16;
    do {
      lVar20 = 0;
      sVar58 = 0;
      uVar15 = uVar18;
      do {
        sVar58 = sVar58 + (ushort)src[(long)(int)uVar15 + (long)iVar10] *
                          *(short *)((long)&sobel_filter_sobel_b + lVar20);
        lVar20 = lVar20 + 2;
        uVar15 = uVar15 + 1;
      } while (lVar20 != 6);
      local_198[lVar17 * 8 + lVar19 + 8] = sVar58;
      lVar19 = lVar19 + 1;
      uVar18 = uVar18 + 1;
    } while (lVar19 != 8);
    lVar17 = lVar17 + 1;
    uVar16 = uVar16 + stride;
  } while (lVar17 != 9);
  psVar11 = local_198;
  lVar17 = 0;
  do {
    lVar19 = 0;
    psVar14 = psVar11;
    do {
      lVar20 = 0;
      sVar58 = 0;
      do {
        sVar58 = sVar58 + psVar14[lVar20 * 4] * *(short *)((long)&sobel_filter_sobel_a + lVar20);
        lVar20 = lVar20 + 2;
      } while (lVar20 != 6);
      local_298[lVar17 * 8 + lVar19] = sVar58;
      lVar19 = lVar19 + 1;
      psVar14 = psVar14 + 1;
    } while (lVar19 != 8);
    lVar17 = lVar17 + 1;
    psVar11 = psVar11 + 8;
  } while (lVar17 != 8);
  lVar17 = 0;
  psVar11 = local_298;
  psVar14 = local_218;
  iVar40 = 0;
  iVar33 = 0;
  iVar26 = 0;
  do {
    iVar43 = 0;
    iVar44 = 0;
    iVar45 = 0;
    iVar36 = 0;
    iVar37 = 0;
    iVar39 = 0;
    iVar30 = 0;
    iVar31 = 0;
    iVar32 = 0;
    lVar19 = 0;
    do {
      uVar1 = *(ulong *)(psVar14 + lVar19);
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uVar1;
      sVar60 = (short)(uVar1 >> 0x30);
      auVar57._8_4_ = 0;
      auVar57._0_8_ = uVar1;
      auVar57._12_2_ = sVar60;
      auVar57._14_2_ = sVar60;
      sVar59 = (short)(uVar1 >> 0x20);
      auVar56._12_4_ = auVar57._12_4_;
      auVar56._8_2_ = 0;
      auVar56._0_8_ = uVar1;
      auVar56._10_2_ = sVar59;
      auVar55._10_6_ = auVar56._10_6_;
      auVar55._8_2_ = sVar59;
      auVar55._0_8_ = uVar1;
      sVar58 = (short)(uVar1 >> 0x10);
      auVar54._8_8_ = auVar55._8_8_;
      auVar54._6_2_ = sVar58;
      auVar54._4_2_ = sVar58;
      auVar54._0_2_ = (short)uVar1;
      auVar54._2_2_ = auVar54._0_2_;
      auVar46 = pmulhw(auVar46,auVar46);
      uVar52 = sVar60 * sVar60;
      auVar47._0_10_ = (unkuint10)uVar52 << 0x30;
      auVar48._0_12_ = ZEXT212(uVar52) << 0x30;
      auVar48._12_2_ = uVar52;
      auVar48._14_2_ = auVar46._6_2_;
      auVar47._12_4_ = auVar48._12_4_;
      auVar47._10_2_ = auVar46._4_2_;
      Var9 = CONCAT64(auVar47._10_6_,CONCAT22(sVar59 * sVar59,uVar52));
      auVar6._4_8_ = (long)((unkuint10)Var9 >> 0x10);
      auVar6._2_2_ = auVar46._2_2_;
      auVar6._0_2_ = sVar58 * sVar58;
      iVar26 = iVar26 + CONCAT22(auVar46._0_2_,auVar54._0_2_ * auVar54._0_2_);
      iVar30 = iVar30 + auVar6._0_4_;
      iVar31 = iVar31 + (int)((unkuint10)Var9 >> 0x10);
      iVar32 = iVar32 + auVar47._12_4_;
      uVar1 = *(ulong *)(psVar11 + lVar19);
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar1;
      sVar60 = (short)(uVar1 >> 0x30);
      auVar3._8_4_ = 0;
      auVar3._0_8_ = uVar1;
      auVar3._12_2_ = sVar60;
      sVar59 = (short)(uVar1 >> 0x20);
      auVar4._8_2_ = sVar59;
      auVar4._0_8_ = uVar1;
      auVar4._10_4_ = auVar3._10_4_;
      auVar7._6_8_ = 0;
      auVar7._0_6_ = auVar4._8_6_;
      sVar58 = (short)(uVar1 >> 0x10);
      auVar5._4_2_ = sVar58;
      auVar5._0_4_ = (uint)uVar1;
      auVar5._6_8_ = SUB148(auVar7 << 0x40,6);
      auVar61._0_4_ = (uint)uVar1 & 0xffff;
      auVar61._4_10_ = auVar5._4_10_;
      auVar61._14_2_ = 0;
      auVar46 = pmaddwd(auVar61,auVar54);
      iVar33 = iVar33 + auVar46._0_4_;
      iVar36 = iVar36 + auVar46._4_4_;
      iVar37 = iVar37 + auVar46._8_4_;
      iVar39 = iVar39 + auVar46._12_4_;
      auVar46 = pmulhw(auVar49,auVar49);
      uVar52 = sVar60 * sVar60;
      auVar50._0_10_ = (unkuint10)uVar52 << 0x30;
      auVar51._0_12_ = ZEXT212(uVar52) << 0x30;
      auVar51._12_2_ = uVar52;
      auVar51._14_2_ = auVar46._6_2_;
      auVar50._12_4_ = auVar51._12_4_;
      auVar50._10_2_ = auVar46._4_2_;
      Var9 = CONCAT64(auVar50._10_6_,CONCAT22(sVar59 * sVar59,uVar52));
      auVar8._4_8_ = (long)((unkuint10)Var9 >> 0x10);
      auVar8._2_2_ = auVar46._2_2_;
      auVar8._0_2_ = sVar58 * sVar58;
      iVar40 = iVar40 + CONCAT22(auVar46._0_2_,(short)uVar1 * (short)uVar1);
      iVar43 = iVar43 + auVar8._0_4_;
      iVar44 = iVar44 + (int)((unkuint10)Var9 >> 0x10);
      iVar45 = iVar45 + auVar50._12_4_;
      lVar19 = lVar19 + 4;
    } while (lVar19 != 8);
    iVar40 = iVar45 + iVar43 + iVar44 + iVar40;
    iVar33 = iVar39 + iVar36 + iVar37 + iVar33;
    iVar26 = iVar32 + iVar30 + iVar31 + iVar26;
    lVar17 = lVar17 + 1;
    psVar11 = psVar11 + 8;
    psVar14 = psVar14 + 8;
  } while (lVar17 != 8);
  dVar27 = (double)iVar33;
  dVar28 = 1.0 / ((double)(iVar26 + 1) * (double)(iVar40 + 1) - dVar27 * dVar27);
  dVar34 = *v;
  iVar33 = 0;
  do {
    __x = *u;
    dVar21 = floor(__x);
    dVar22 = floor(dVar34);
    dVar29 = __x - dVar21;
    dVar34 = dVar34 - dVar22;
    dVar53 = dVar29 * dVar29;
    dVar35 = dVar29 * dVar53;
    dVar23 = rint((dVar35 * -0.5 + dVar29 * -0.5 + dVar53) * 16384.0);
    dVar24 = rint((dVar35 * 1.5 + dVar53 * -2.5 + 1.0) * 16384.0);
    dVar29 = rint((dVar35 * -1.5 + dVar29 * 0.5 + dVar53 + dVar53) * 16384.0);
    dVar35 = rint((dVar53 * -0.5 + dVar35 * 0.5) * 16384.0);
    dVar53 = dVar34 * dVar34;
    dVar41 = dVar34 * dVar53;
    __x_00 = (dVar41 * -1.5 + dVar34 * 0.5 + dVar53 + dVar53) * 16384.0;
    dVar38 = (dVar53 * -0.5 + dVar41 * 0.5) * 16384.0;
    iVar31 = (int)dVar21 + x;
    iVar30 = width;
    if (iVar31 < width) {
      iVar30 = iVar31;
    }
    if (iVar31 < -9) {
      iVar30 = -9;
    }
    iVar32 = (int)dVar22 + y;
    iVar31 = height;
    if (iVar32 < height) {
      iVar31 = iVar32;
    }
    if (iVar32 < -9) {
      iVar31 = -9;
    }
    puVar12 = ref + (long)iVar30 + ((long)iVar31 + -1) * (long)stride;
    iVar32 = (iVar31 + -1) * stride;
    iVar31 = iVar30 + iVar32;
    iVar30 = iVar30 + iVar32 + -1;
    lVar17 = -1;
    psVar11 = local_198;
    do {
      lVar19 = 0;
      do {
        iVar32 = (int)lVar19;
        *(int *)(psVar11 + lVar19 * 2) =
             (int)((uint)ref[iVar31 + iVar32 + 1] * (int)dVar29 +
                   (uint)puVar12[lVar19] * (int)dVar24 + (uint)ref[iVar30 + iVar32] * (int)dVar23 +
                   (uint)ref[iVar31 + iVar32 + 2] * (int)dVar35 + 0x80) >> 8;
        lVar19 = lVar19 + 1;
      } while (lVar19 != 8);
      lVar17 = lVar17 + 1;
      psVar11 = psVar11 + 0x10;
      puVar12 = puVar12 + stride;
      iVar31 = iVar31 + stride;
      iVar30 = iVar30 + stride;
    } while (lVar17 != 10);
    dVar21 = rint(__x_00);
    uStack_304 = (undefined4)((ulong)__x_00 >> 0x20);
    uStack_300 = SUB84(dVar38,0);
    uStack_2fc = (undefined4)((ulong)dVar38 >> 0x20);
    auVar2._4_8_ = extraout_XMM0_Qb;
    auVar2._0_4_ = uStack_304;
    auVar25._0_8_ = auVar2._0_8_ << 0x20;
    auVar25._8_4_ = uStack_300;
    auVar25._12_4_ = uStack_2fc;
    dVar22 = rint(auVar25._8_8_);
    dVar34 = rint((dVar41 * -0.5 + dVar34 * -0.5 + dVar53) * 16384.0);
    dVar23 = rint((dVar41 * 1.5 + dVar53 * -2.5 + 1.0) * 16384.0);
    iVar36 = (int)dVar23;
    lVar17 = 0;
    puVar13 = local_138;
    psVar11 = local_218;
    psVar14 = local_298;
    iVar31 = 0;
    iVar32 = 0;
    iVar30 = iVar10;
    do {
      lVar19 = -8;
      do {
        auVar42._4_4_ = iVar36;
        auVar42._0_4_ = iVar36;
        auVar42._8_4_ = (int)dVar22;
        auVar42._12_4_ = (int)dVar22;
        iVar37 = ((int)((auVar42._8_8_ & 0xffffffff) * (ulong)*(uint *)(puVar13 + lVar19 * 4 + 0x20)
                       ) + iVar36 * *(int *)(puVar13 + lVar19 * 4 + -0x20) +
                  *(int *)(puVar13 + lVar19 * 4) * (int)dVar21 +
                  *(int *)(puVar13 + lVar19 * 4 + -0x40) * (int)dVar34 + 0x10000 >> 0x11) +
                 (uint)src[iVar30 + (int)lVar19 + 8] * -8;
        iVar31 = iVar31 + psVar11[lVar19 + 8] * iVar37;
        iVar32 = iVar32 + psVar14[lVar19 + 8] * iVar37;
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0);
      lVar17 = lVar17 + 1;
      iVar30 = iVar30 + stride;
      psVar14 = psVar14 + 8;
      psVar11 = psVar11 + 8;
      puVar13 = puVar13 + 0x20;
    } while (lVar17 != 8);
    dVar21 = (double)iVar31 * (double)(iVar40 + 1) * dVar28 + (double)iVar32 * -dVar27 * dVar28;
    dVar22 = (double)iVar31 * -dVar27 * dVar28 + (double)iVar32 * dVar28 * (double)(iVar26 + 1);
    dVar34 = 2.0;
    if (dVar21 <= 2.0) {
      dVar34 = dVar21;
    }
    *u = __x + (double)(-(ulong)(dVar21 < -2.0) & 0xc000000000000000 |
                       ~-(ulong)(dVar21 < -2.0) & (ulong)dVar34);
    dVar34 = 2.0;
    if (dVar22 <= 2.0) {
      dVar34 = dVar22;
    }
    dVar34 = (double)(-(ulong)(dVar22 < -2.0) & 0xc000000000000000 |
                     ~-(ulong)(dVar22 < -2.0) & (ulong)dVar34) + *v;
    *v = dVar34;
  } while ((0.125 <= ABS(dVar22) + ABS(dVar21)) && (iVar33 = iVar33 + 1, iVar33 != 4));
  return;
}

Assistant:

void aom_compute_flow_at_point_c(const uint8_t *src, const uint8_t *ref, int x,
                                 int y, int width, int height, int stride,
                                 double *u, double *v) {
  double M[4];
  double M_inv[4];
  int b[2];
  int16_t dx[DISFLOW_PATCH_SIZE * DISFLOW_PATCH_SIZE];
  int16_t dy[DISFLOW_PATCH_SIZE * DISFLOW_PATCH_SIZE];

  // Compute gradients within this patch
  const uint8_t *src_patch = &src[y * stride + x];
  sobel_filter(src_patch, stride, dx, DISFLOW_PATCH_SIZE, 1);
  sobel_filter(src_patch, stride, dy, DISFLOW_PATCH_SIZE, 0);

  compute_flow_matrix(dx, DISFLOW_PATCH_SIZE, dy, DISFLOW_PATCH_SIZE, M);
  invert_2x2(M, M_inv);

  for (int itr = 0; itr < DISFLOW_MAX_ITR; itr++) {
    compute_flow_vector(src, ref, width, height, stride, x, y, *u, *v, dx, dy,
                        b);

    // Solve flow equations to find a better estimate for the flow vector
    // at this point
    const double step_u = M_inv[0] * b[0] + M_inv[1] * b[1];
    const double step_v = M_inv[2] * b[0] + M_inv[3] * b[1];
    *u += fclamp(step_u * DISFLOW_STEP_SIZE, -2, 2);
    *v += fclamp(step_v * DISFLOW_STEP_SIZE, -2, 2);

    if (fabs(step_u) + fabs(step_v) < DISFLOW_STEP_SIZE_THRESOLD) {
      // Stop iteration when we're close to convergence
      break;
    }
  }
}